

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

void frame_set_pad(nghttp2_buf *buf,size_t padlen,int framehd_only)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  size_t __n;
  size_t newlen;
  size_t trail_padlen;
  int framehd_only_local;
  size_t padlen_local;
  nghttp2_buf *buf_local;
  
  puVar1 = buf->pos;
  uVar2 = *(undefined8 *)buf->pos;
  puVar1[7] = buf->pos[8];
  *(undefined8 *)(puVar1 + -1) = uVar2;
  buf->pos = buf->pos + -1;
  buf->pos[4] = buf->pos[4] | 8;
  uVar3 = nghttp2_get_uint32(buf->pos);
  nghttp2_put_uint32be(buf->pos,((uVar3 >> 8) + (int)padlen) * 0x100 + (uint)buf->pos[3]);
  if (framehd_only == 0) {
    __n = padlen - 1;
    buf->pos[9] = (uint8_t)__n;
    memset(buf->last,0,__n);
    buf->last = buf->last + __n;
  }
  return;
}

Assistant:

static void frame_set_pad(nghttp2_buf *buf, size_t padlen, int framehd_only) {
  size_t trail_padlen;
  size_t newlen;

  DEBUGF("send: padlen=%zu, shift left 1 bytes\n", padlen);

  memmove(buf->pos - 1, buf->pos, NGHTTP2_FRAME_HDLEN);

  --buf->pos;

  buf->pos[4] |= NGHTTP2_FLAG_PADDED;

  newlen = (nghttp2_get_uint32(buf->pos) >> 8) + padlen;
  nghttp2_put_uint32be(buf->pos, (uint32_t)((newlen << 8) + buf->pos[3]));

  if (framehd_only) {
    return;
  }

  trail_padlen = padlen - 1;
  buf->pos[NGHTTP2_FRAME_HDLEN] = (uint8_t)trail_padlen;

  /* zero out padding */
  memset(buf->last, 0, trail_padlen);
  /* extend buffers trail_padlen bytes, since we ate previous padlen -
     trail_padlen byte(s) */
  buf->last += trail_padlen;
}